

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::TransitionShaderResources
          (DeviceContextVkImpl *this,IShaderResourceBinding *pShaderResourceBinding)

{
  ShaderResourceBindingVkImpl *pSVar1;
  string msg;
  string local_38;
  
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[56]>
              (&local_38,(char (*) [56])"State transitions are not allowed inside a render pass.");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"TransitionShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x20c);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (pShaderResourceBinding == (IShaderResourceBinding *)0x0) {
    FormatString<char[40]>(&local_38,(char (*) [40])0x5c204b);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"TransitionShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x20d);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pSVar1 = ClassPtrCast<Diligent::ShaderResourceBindingVkImpl,Diligent::IShaderResourceBinding>
                     (pShaderResourceBinding);
  ShaderResourceCacheVk::TransitionResources<false>
            (&(pSVar1->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
              m_ShaderResourceCache,this);
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionShaderResources(IShaderResourceBinding* pShaderResourceBinding)
{
    DEV_CHECK_ERR(!m_pActiveRenderPass, "State transitions are not allowed inside a render pass.");
    DEV_CHECK_ERR(pShaderResourceBinding != nullptr, "pShaderResourceBinding must not be null");

    ShaderResourceBindingVkImpl* pResBindingVkImpl = ClassPtrCast<ShaderResourceBindingVkImpl>(pShaderResourceBinding);
    ShaderResourceCacheVk&       ResourceCache     = pResBindingVkImpl->GetResourceCache();

    ResourceCache.TransitionResources<false>(this);
}